

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O1

void bitset_print(bitset_t *b)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  putchar(0x7b);
  uVar6 = 0;
  do {
    uVar3 = uVar6 >> 6;
    if (uVar3 < b->arraysize) {
      uVar5 = b->array[uVar3] >> ((byte)uVar6 & 0x3f);
      if (uVar5 == 0) {
        lVar4 = uVar3 * -0x40;
        do {
          uVar3 = uVar3 + 1;
          if (b->arraysize == uVar3) goto LAB_00110e38;
          uVar5 = b->array[uVar3];
          lVar4 = lVar4 + -0x40;
        } while (uVar5 == 0);
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        uVar6 = lVar1 - lVar4;
      }
      else {
        lVar4 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar6 = uVar6 + lVar4;
      }
      bVar2 = true;
    }
    else {
LAB_00110e38:
      bVar2 = false;
    }
    if (!bVar2) {
      putchar(0x7d);
      return;
    }
    printf("%zu, ",uVar6);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

inline void bitset_print(const bitset_t *b) {
    printf("{");
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        printf("%zu, ", i);
    }
    printf("}");
}